

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-logger.cpp
# Opt level: O3

Entity * EntityMaker_CustomEntity(string *objname)

{
  Entity *this;
  
  this = (Entity *)operator_new(0xd8);
  dynamicgraph::CustomEntity::CustomEntity((CustomEntity *)this,objname);
  return this;
}

Assistant:

explicit CustomEntity(const std::string &n) : Entity(n) {
    logger_.setTimeSample(0.001);
    logger_.setStreamPrintPeriod(0.005);

    logger_.setVerbosity(VERBOSITY_NONE);
    BOOST_CHECK_EQUAL(logger_.getVerbosity(), VERBOSITY_NONE);
    BOOST_CHECK(logger_.stream(MSG_TYPE_DEBUG).isNull());
    BOOST_CHECK(logger_.stream(MSG_TYPE_INFO).isNull());
    BOOST_CHECK(logger_.stream(MSG_TYPE_WARNING).isNull());
    BOOST_CHECK(logger_.stream(MSG_TYPE_ERROR).isNull());

    logger_.setVerbosity(VERBOSITY_ERROR);
    BOOST_CHECK_EQUAL(logger_.getVerbosity(), VERBOSITY_ERROR);
    BOOST_CHECK(logger_.stream(MSG_TYPE_DEBUG).isNull());
    BOOST_CHECK(logger_.stream(MSG_TYPE_INFO).isNull());
    BOOST_CHECK(logger_.stream(MSG_TYPE_WARNING).isNull());
    BOOST_CHECK(!logger_.stream(MSG_TYPE_ERROR).isNull());

    logger_.setVerbosity(VERBOSITY_WARNING_ERROR);
    BOOST_CHECK_EQUAL(logger_.getVerbosity(), VERBOSITY_WARNING_ERROR);
    BOOST_CHECK(logger_.stream(MSG_TYPE_DEBUG).isNull());
    BOOST_CHECK(logger_.stream(MSG_TYPE_INFO).isNull());
    BOOST_CHECK(!logger_.stream(MSG_TYPE_WARNING).isNull());
    BOOST_CHECK(!logger_.stream(MSG_TYPE_ERROR).isNull());

    logger_.setVerbosity(VERBOSITY_INFO_WARNING_ERROR);
    BOOST_CHECK_EQUAL(logger_.getVerbosity(), VERBOSITY_INFO_WARNING_ERROR);
    BOOST_CHECK(logger_.stream(MSG_TYPE_DEBUG).isNull());
    BOOST_CHECK(!logger_.stream(MSG_TYPE_INFO).isNull());
    BOOST_CHECK(!logger_.stream(MSG_TYPE_WARNING).isNull());
    BOOST_CHECK(!logger_.stream(MSG_TYPE_ERROR).isNull());

    logger_.setVerbosity(VERBOSITY_ALL);
    BOOST_CHECK_EQUAL(logger_.getVerbosity(), VERBOSITY_ALL);
    BOOST_CHECK(!logger_.stream(MSG_TYPE_DEBUG).isNull());
    BOOST_CHECK(!logger_.stream(MSG_TYPE_INFO).isNull());
    BOOST_CHECK(!logger_.stream(MSG_TYPE_WARNING).isNull());
    BOOST_CHECK(!logger_.stream(MSG_TYPE_ERROR).isNull());
  }